

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O2

array_t<unsigned_char,_16> __thiscall
CoreML::MilStoragePython::MilStoragePythonReader::read_uint4_data
          (MilStoragePythonReader *this,uint64_t offset)

{
  uchar *__first;
  uint64_t in_RDX;
  long lVar1;
  Span<const_MILBlob::UInt4,_18446744073709551615UL> SVar2;
  vector<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_> unpackedUIntSubByteData;
  allocator_type local_41;
  _Vector_base<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SVar2 = MILBlob::Blob::StorageReader::GetDataView<MILBlob::UInt4>
                    (*(StorageReader **)offset,in_RDX);
  __first = (uchar *)SVar2.m_ptr;
  lVar1 = (ulong)((uint)SVar2.m_size.m_size & 1) +
          (SVar2.m_size.m_size.m_size >> 1 & 0x1fffffffffffffff);
  if (lVar1 == 0) {
    __first = (uchar *)0x0;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,__first,
             __first + lVar1,&local_41);
  MILBlob::UnPackSubByteVec<MILBlob::UInt4>
            ((vector<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_> *)&local_40,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
             SVar2.m_size.m_size.m_size);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  pybind11::array_t<unsigned_char,_16>::array_t
            ((array_t<unsigned_char,_16> *)this,
             (long)local_40._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40._M_impl.super__Vector_impl_data._M_start,
             &(local_40._M_impl.super__Vector_impl_data._M_start)->data,(handle)0x0);
  std::_Vector_base<MILBlob::UInt4,_std::allocator<MILBlob::UInt4>_>::~_Vector_base(&local_40);
  return (array)(array)this;
}

Assistant:

py::array_t<uint8_t> MilStoragePythonReader::read_uint4_data(uint64_t offset) {
    return readUnsignedSubByteData<MILBlob::UInt4>(*m_reader, offset);
}